

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O2

UBool __thiscall icu_63::LocDataParser::inList(LocDataParser *this,UChar c,UChar *list)

{
  UChar UVar1;
  UBool UVar2;
  
  if ((*list == L' ') && (UVar2 = PatternProps::isWhiteSpace((uint)(ushort)c), UVar2 != '\0')) {
    return '\x01';
  }
  do {
    UVar1 = *list;
    if (UVar1 == L'\0') break;
    list = list + 1;
  } while (UVar1 != c);
  return UVar1 == c;
}

Assistant:

inline UBool inList(UChar c, const UChar* list) const {
        if (*list == SPACE && PatternProps::isWhiteSpace(c)) {
            return TRUE;
        }
        while (*list && *list != c) {
            ++list;
        }
        return *list == c;
    }